

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall ncnn::Option::Option(Option *this)

{
  int iVar1;
  undefined1 *in_RDI;
  
  *in_RDI = 1;
  iVar1 = get_cpu_count();
  *(int *)(in_RDI + 4) = iVar1;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  in_RDI[0x18] = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 1;
  *(undefined4 *)(in_RDI + 0x20) = 1;
  *(undefined4 *)(in_RDI + 0x24) = 1;
  return;
}

Assistant:

Option::Option()
{
    lightmode = true;
    num_threads = get_cpu_count();
    blob_allocator = 0;
    workspace_allocator = 0;

    vulkan_compute = false;

#if NCNN_VULKAN
    blob_vkallocator = 0;
    workspace_vkallocator = 0;
    staging_vkallocator = 0;
#endif // NCNN_VULKAN

    use_winograd_convolution = 1;
    use_sgemm_convolution = 1;
    use_int8_inference = 1;
}